

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O2

void __thiscall rengine::TestBase::addTest(TestBase *this,StaticRenderTest *test)

{
  StaticRenderTest *local_18;
  StaticRenderTest *test_local;
  
  local_18 = test;
  std::__cxx11::list<rengine::StaticRenderTest_*,_std::allocator<rengine::StaticRenderTest_*>_>::
  push_back(&this->tests,&local_18);
  (*((this->super_StandardSurface).super_Surface.m_impl)->_vptr_SurfaceBackendImpl[8])();
  return;
}

Assistant:

void addTest(StaticRenderTest *test) {
        tests.push_back(test);
        requestRender();
    }